

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  mbedtls_asn1_named_data *pmVar5;
  mbedtls_x509_name *pmVar6;
  uchar *puVar7;
  mbedtls_x509_name *pmVar8;
  byte *end_00;
  size_t local_48;
  size_t set_len;
  size_t local_38;
  
  pmVar6 = cur;
LAB_0020aaa8:
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_48,0x31);
  if (iVar2 == 0) {
    puVar7 = *p + local_48;
    pmVar8 = pmVar6;
    set_len = (size_t)puVar7;
    do {
      iVar3 = mbedtls_asn1_get_tag(p,puVar7,&local_38,0x30);
      if (iVar3 == 0) {
        iVar2 = -0x23e0;
        if ((long)local_38 < 1) goto LAB_0020ac36;
        end_00 = *p + local_38;
        (pmVar8->oid).tag = (uint)**p;
        iVar3 = mbedtls_asn1_get_tag(p,end_00,&(pmVar8->oid).len,6);
        puVar7 = (uchar *)set_len;
        if (iVar3 != 0) goto LAB_0020ab98;
        puVar7 = *p;
        (pmVar8->oid).p = puVar7;
        pbVar4 = puVar7 + (pmVar8->oid).len;
        *p = pbVar4;
        if (end_00 == pbVar4 || (long)end_00 - (long)pbVar4 < 0) goto LAB_0020ac36;
        iVar2 = -0x23e2;
        if ((0x1e < *pbVar4) || ((0x50581008U >> (*pbVar4 & 0x1f) & 1) == 0)) goto LAB_0020ac36;
        *p = pbVar4 + 1;
        (pmVar8->val).tag = (uint)*pbVar4;
        iVar3 = mbedtls_asn1_get_len(p,end_00,&(pmVar8->val).len);
        puVar7 = (uchar *)set_len;
        if (iVar3 != 0) goto LAB_0020ab98;
        puVar1 = *p;
        (pmVar8->val).p = puVar1;
        pbVar4 = puVar1 + (pmVar8->val).len;
        *p = pbVar4;
        if (pbVar4 != end_00) {
          iVar2 = -0x23e6;
          goto LAB_0020ac36;
        }
        pmVar8->next = (mbedtls_asn1_named_data *)0x0;
      }
      else {
LAB_0020ab98:
        iVar2 = iVar3 + -0x2380;
        if (iVar2 != 0) goto LAB_0020ac36;
      }
      if (*p == puVar7) goto LAB_0020abf0;
      pmVar8->next_merged = '\x01';
      pmVar5 = (mbedtls_asn1_named_data *)calloc(1,0x40);
      pmVar8->next = pmVar5;
      pmVar8 = pmVar5;
      if (pmVar5 == (mbedtls_asn1_named_data *)0x0) goto LAB_0020ac1c;
    } while( true );
  }
  iVar2 = iVar2 + -0x2380;
  goto LAB_0020ac36;
LAB_0020abf0:
  if (puVar7 == end) {
    return 0;
  }
  pmVar6 = (mbedtls_x509_name *)calloc(1,0x40);
  pmVar8->next = pmVar6;
  if (pmVar6 == (mbedtls_asn1_named_data *)0x0) {
LAB_0020ac1c:
    iVar2 = -0x2880;
LAB_0020ac36:
    mbedtls_asn1_free_named_data_list_shallow(cur->next);
    cur->next = (mbedtls_asn1_named_data *)0x0;
    return iVar2;
  }
  goto LAB_0020aaa8;
}

Assistant:

int mbedtls_x509_get_name(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_name *cur)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t set_len;
    const unsigned char *end_set;
    mbedtls_x509_name *head = cur;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while (1) {
        /*
         * parse SET
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &set_len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET)) != 0) {
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_NAME, ret);
            goto error;
        }

        end_set  = *p + set_len;

        while (1) {
            if ((ret = x509_get_attr_type_value(p, end_set, cur)) != 0) {
                goto error;
            }

            if (*p == end_set) {
                break;
            }

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

            if (cur->next == NULL) {
                ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
                goto error;
            }

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if (*p == end) {
            return 0;
        }

        cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

        if (cur->next == NULL) {
            ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
            goto error;
        }

        cur = cur->next;
    }

error:
    /* Skip the first element as we did not allocate it */
    mbedtls_asn1_free_named_data_list_shallow(head->next);
    head->next = NULL;

    return ret;
}